

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O0

void Fxu_PairAllocStorage(Fxu_Var *pVar,int nCubes)

{
  Fxu_Pair ***pppFVar1;
  Fxu_Pair **ppFVar2;
  int local_18;
  int k;
  int nCubes_local;
  Fxu_Var *pVar_local;
  
  pVar->nCubes = nCubes;
  pppFVar1 = (Fxu_Pair ***)malloc((long)nCubes << 3);
  pVar->ppPairs = pppFVar1;
  ppFVar2 = (Fxu_Pair **)malloc((long)(nCubes * nCubes) << 3);
  *pVar->ppPairs = ppFVar2;
  memset(*pVar->ppPairs,0,(long)nCubes * 8 * (long)nCubes);
  for (local_18 = 1; local_18 < nCubes; local_18 = local_18 + 1) {
    pVar->ppPairs[local_18] = pVar->ppPairs[local_18 + -1] + nCubes;
  }
  return;
}

Assistant:

void Fxu_PairAllocStorage( Fxu_Var * pVar, int nCubes )
{
    int k;
//    assert( pVar->nCubes == 0 );
    pVar->nCubes  = nCubes;
    // allocate memory for all the pairs
    pVar->ppPairs    = ABC_ALLOC( Fxu_Pair **, nCubes );
    pVar->ppPairs[0] = ABC_ALLOC( Fxu_Pair *,  nCubes * nCubes );
    memset( pVar->ppPairs[0], 0, sizeof(Fxu_Pair *) * nCubes * nCubes );
    for ( k = 1; k < nCubes; k++ )
        pVar->ppPairs[k] = pVar->ppPairs[k-1] + nCubes;
}